

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void float32_suite::test_minus_max(void)

{
  undefined4 local_5c;
  value local_58 [2];
  float local_50;
  type local_4c [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [5];
  
  decoder.current.view._M_str._3_4_ = 0x7fffffc5;
  decoder.current.view._M_str._7_1_ = 0xff;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[5]>
            ((decoder *)local_38,(uchar (*) [5])((long)&decoder.current.view._M_str + 3));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xc5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2d0,"void float32_suite::test_minus_max()",local_40,&local_44);
  local_4c[0] = trial::protocol::bintoken::detail::decoder::
                value<trial::protocol::bintoken::token::float32>((decoder *)local_38);
  local_50 = std::numeric_limits<float>::max();
  local_50 = -local_50;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("decoder.value<token::float32>()","-std::numeric_limits<token::float32::type>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2d2,"void float32_suite::test_minus_max()",local_4c,&local_50);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_58[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2d4,"void float32_suite::test_minus_max()",local_58,&local_5c);
  return;
}

Assistant:

void test_minus_max()
{
    const value_type input[] = { token::code::float32, 0xFF, 0xFF, 0x7F, 0xFF };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::float32>(),
                              -std::numeric_limits<token::float32::type>::max());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}